

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O0

void calc_similarity_from_indexer_with_references<float,unsigned_long>
               (float *numeric_data,int *categ_data,float *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,size_t nrows,int nthreads,bool standardize_dist,
               IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,double *rmat,
               TreesIndexer *indexer,bool is_col_major,size_t ld_numeric,size_t ld_categ)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  runtime_error *this;
  size_t nrows_00;
  ulong uVar4;
  size_t *Xr_indptr;
  void *__s;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  double *pdVar7;
  reference pvVar8;
  double *pdVar9;
  SignalSwitcher *in_RCX;
  long lVar10;
  float *in_RDX;
  size_t *in_RSI;
  SignalSwitcher *in_R8;
  ulong in_R9;
  undefined4 uVar11;
  double dVar12;
  undefined4 uVar16;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  byte in_stack_00000010;
  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
  *in_stack_00000018;
  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
  *in_stack_00000020;
  long in_stack_00000028;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_stack_00000030;
  byte in_stack_00000038;
  float *in_stack_00000040;
  size_t *in_stack_00000048;
  size_t ix_1;
  double div_trees_1;
  size_t ix;
  double div_trees;
  double ntrees_dbl;
  size_t size_rmat;
  size_t ref;
  size_t tree;
  double *rmat_this;
  double *node_dist_this;
  double *node_depths_this;
  unsigned_long *ind_this;
  size_t *ref_this;
  size_t ncomb_this;
  size_t n_terminal_this;
  size_t j;
  size_t i;
  size_t row;
  unique_ptr<double[],_std::default_delete<double[]>_> ignored;
  vector<unsigned_long,_std::allocator<unsigned_long>_> terminal_indices;
  size_t ntrees;
  SignalSwitcher ss;
  size_t n_ref;
  TreesIndexer *in_stack_fffffffffffffbe8;
  SignalSwitcher *in_stack_fffffffffffffbf0;
  allocator_type *in_stack_fffffffffffffc00;
  SignalSwitcher *ss_00;
  size_type in_stack_fffffffffffffc08;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  int iVar17;
  long local_3a0;
  long local_390;
  undefined1 standardize;
  SignalSwitcher *ncols_categ;
  SignalSwitcher *ncols_numeric;
  SignalSwitcher *pSVar18;
  float *categ_data_00;
  float *numeric_data_00;
  SignalSwitcher *local_340;
  SignalSwitcher *local_330;
  undefined7 in_stack_fffffffffffffcf8;
  byte bVar19;
  size_type local_2d8;
  IsoForest *in_stack_fffffffffffffd30;
  ExtIsoForest *in_stack_fffffffffffffd38;
  double *in_stack_fffffffffffffd40;
  size_t *in_stack_fffffffffffffd48;
  double *in_stack_fffffffffffffd50;
  ulong local_290;
  ulong local_280;
  ulong local_260;
  ulong local_258;
  ulong local_208;
  undefined1 local_1f1 [25];
  size_type local_1d8;
  undefined1 local_1ba;
  string local_90 [32];
  size_t local_70;
  byte local_62;
  byte local_61;
  ulong local_60;
  SignalSwitcher *local_58;
  SignalSwitcher *local_50;
  float *local_48;
  size_t *local_40;
  undefined1 is_col_major_00;
  
  iVar17 = (int)((ulong)in_stack_fffffffffffffc38 >> 0x20);
  local_61 = in_stack_00000010 & 1;
  local_62 = in_stack_00000038 & 1;
  local_60 = in_R9;
  local_58 = in_R8;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  local_70 = get_number_of_reference_points(in_stack_fffffffffffffbe8);
  if (local_70 != 0) {
    SignalSwitcher::SignalSwitcher(in_stack_fffffffffffffbf0);
    if (in_stack_00000018 ==
        (vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
         *)0x0) {
      local_2d8 = std::
                  vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ::size(in_stack_00000020);
    }
    else {
      local_2d8 = std::
                  vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  ::size(in_stack_00000018);
    }
    local_1d8 = local_2d8;
    nrows_00 = local_60 * local_2d8;
    iVar17 = (int)local_1f1;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x60d12c);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x60d158);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_60;
    uVar4 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    Xr_indptr = (size_t *)operator_new__(uVar4);
    std::unique_ptr<double[],std::default_delete<double[]>>::
    unique_ptr<double*,std::default_delete<double[]>,void,bool>
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffbf0,
               (double *)in_stack_fffffffffffffbe8);
    if ((local_62 & 1) == 0) {
      local_330 = (SignalSwitcher *)0x0;
    }
    else {
      local_330 = local_50;
    }
    if ((local_62 & 1) == 0) {
      local_340 = (SignalSwitcher *)0x0;
    }
    else {
      local_340 = local_58;
    }
    categ_data_00 = local_48;
    if ((local_62 & 1) != 0) {
      categ_data_00 = (float *)0x0;
    }
    ss_00 = local_50;
    if ((local_62 & 1) != 0) {
      ss_00 = (SignalSwitcher *)0x0;
    }
    ncols_categ = local_58;
    if ((local_62 & 1) != 0) {
      ncols_categ = (SignalSwitcher *)0x0;
    }
    ncols_numeric = ss_00;
    pSVar18 = ss_00;
    numeric_data_00 = categ_data_00;
    bVar19 = local_62;
    std::unique_ptr<double[],_std::default_delete<double[]>_>::get
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffbf0);
    is_col_major_00 = (undefined1)((ulong)pSVar18 >> 0x38);
    standardize = (undefined1)((ulong)in_stack_00000020 >> 0x38);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x60d383);
    predict_iforest(numeric_data_00,(int *)categ_data_00,(bool)is_col_major_00,(size_t)ncols_numeric
                    ,(size_t)ncols_categ,(float *)&stack0xfffffffffffffbe8,local_40,
                    (size_t *)CONCAT17(bVar19,in_stack_fffffffffffffcf8),in_stack_00000040,
                    in_stack_00000048,Xr_indptr,nrows_00,iVar17,(bool)standardize,
                    in_stack_fffffffffffffd30,in_stack_fffffffffffffd38,in_stack_fffffffffffffd40,
                    in_stack_fffffffffffffd48,in_stack_fffffffffffffd50,(TreesIndexer *)in_RCX);
    std::unique_ptr<double[],_std::default_delete<double[]>_>::reset
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)local_340,local_330);
    check_interrupt_switch(ss_00);
    for (local_208 = 0; local_208 < local_60; local_208 = local_208 + 1) {
      if ((interrupt_switch & 1U) == 0) {
        __s = (void *)(in_stack_00000028 + local_208 * local_70 * 8);
        memset(__s,0,local_70 << 3);
        for (local_258 = 0; local_258 < local_1d8; local_258 = local_258 + 1) {
          std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::operator[]
                    (in_stack_00000030,local_258);
          puVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x60d578);
          puVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x60d58d);
          lVar10 = local_258 * local_60;
          std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::operator[]
                    (in_stack_00000030,local_258);
          pdVar7 = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x60d5ce);
          pvVar8 = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::operator[]
                             (in_stack_00000030,local_258);
          uVar4 = pvVar8->n_terminal;
          std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::operator[]
                    (in_stack_00000030,local_258);
          pdVar9 = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x60d61b);
          if ((uVar4 & 1) == 0) {
            local_390 = (uVar4 >> 1) * (uVar4 - 1);
          }
          else {
            local_390 = uVar4 * (uVar4 - 1 >> 1);
          }
          for (local_260 = 0; local_260 < local_70; local_260 = local_260 + 1) {
            uVar1 = puVar6[lVar10 + local_208];
            uVar2 = puVar5[local_260];
            if (uVar1 == uVar2) {
              *(double *)((long)__s + local_260 * 8) =
                   pdVar7[uVar1] + 3.0 + *(double *)((long)__s + local_260 * 8);
            }
            else {
              if (uVar1 < uVar2) {
                local_3a0 = (local_390 + (uVar2 - uVar1) + -1) -
                            ((uVar4 - uVar1) * ((uVar4 - uVar1) + -1) >> 1);
              }
              else {
                local_3a0 = (local_390 + (uVar1 - uVar2) + -1) -
                            ((uVar4 - uVar2) * ((uVar4 - uVar2) + -1) >> 1);
              }
              *(double *)((long)__s + local_260 * 8) =
                   pdVar9[local_3a0] + *(double *)((long)__s + local_260 * 8);
            }
          }
        }
      }
    }
    check_interrupt_switch(ss_00);
    local_60 = local_60 * local_70;
    uVar11 = (undefined4)local_1d8;
    uVar16 = (undefined4)(local_1d8 >> 0x20);
    if ((local_61 & 1) == 0) {
      auVar15._8_4_ = uVar16;
      auVar15._0_8_ = local_1d8;
      auVar15._12_4_ = 0x45300000;
      for (local_290 = 0; local_290 < local_60; local_290 = local_290 + 1) {
        *(double *)(in_stack_00000028 + local_290 * 8) =
             *(double *)(in_stack_00000028 + local_290 * 8) /
             ((auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0));
      }
    }
    else {
      auVar13._8_4_ = uVar16;
      auVar13._0_8_ = local_1d8;
      auVar13._12_4_ = 0x45300000;
      lVar10 = local_1d8 * 2;
      auVar14._8_4_ = (int)((ulong)lVar10 >> 0x20);
      auVar14._0_8_ = lVar10;
      auVar14._12_4_ = 0x45300000;
      for (local_280 = 0; local_280 < local_60; local_280 = local_280 + 1) {
        dVar12 = exp2(-(*(double *)(in_stack_00000028 + local_280 * 8) -
                       ((auVar13._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,uVar11) - 4503599627370496.0))) /
                      ((auVar14._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)));
        *(double *)(in_stack_00000028 + local_280 * 8) = dVar12;
      }
    }
    check_interrupt_switch(ss_00);
    std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)local_340);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)ss_00);
    SignalSwitcher::~SignalSwitcher(local_340);
    return;
  }
  local_1ba = 1;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  std::operator+(in_stack_fffffffffffffc28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  std::operator+(in_stack_fffffffffffffc28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  std::__cxx11::to_string(iVar17);
  std::operator+(in_stack_fffffffffffffc28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  std::operator+(in_stack_fffffffffffffc28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffc24,in_stack_fffffffffffffc20));
  std::runtime_error::runtime_error(this,local_90);
  local_1ba = 0;
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void calc_similarity_from_indexer_with_references
(
    real_t *restrict numeric_data, int *restrict categ_data,
    real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
    size_t nrows, int nthreads, bool standardize_dist,
    IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
    double *restrict rmat,
    TreesIndexer *indexer, bool is_col_major, size_t ld_numeric, size_t ld_categ
)
{
    size_t n_ref = get_number_of_reference_points(*indexer);
    if (unlikely(!n_ref)) unexpected_error();

    SignalSwitcher ss;

    size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
    std::vector<sparse_ix> terminal_indices(nrows * ntrees);
    std::unique_ptr<double[]> ignored(new double[nrows]);
    predict_iforest(numeric_data, categ_data,
                    is_col_major, ld_numeric, ld_categ,
                    is_col_major? Xc : nullptr, is_col_major? Xc_ind : nullptr, is_col_major? Xc_indptr : nullptr,
                    is_col_major? (real_t*)nullptr : Xc, is_col_major? (sparse_ix*)nullptr : Xc_ind, is_col_major? (sparse_ix*)nullptr : Xc_indptr,
                    nrows, nthreads, false,
                    model_outputs, model_outputs_ext,
                    ignored.get(), terminal_indices.data(),
                    (double*)NULL,
                    indexer);
    ignored.reset();

    #ifndef _OPENMP
    nthreads = 1;
    #endif

    check_interrupt_switch(ss);

    #pragma omp parallel for schedule(static) num_threads(nthreads) \
            shared(rmat, terminal_indices, nrows, n_ref, indexer, ntrees)
    for (size_t_for row = 0; row < (decltype(row))nrows; row++)
    {
        if (interrupt_switch) continue;

        size_t i, j;
        size_t n_terminal_this;
        size_t ncomb_this;
        size_t *restrict ref_this;
        sparse_ix *restrict ind_this;
        double *restrict node_depths_this;
        double *restrict node_dist_this;
        double *rmat_this = rmat + row*n_ref;
        memset(rmat_this, 0, n_ref*sizeof(double));
        for (size_t tree = 0; tree < ntrees; tree++)
        {
            ref_this = indexer->indices[tree].reference_points.data();
            ind_this = terminal_indices.data() + tree*nrows;
            node_depths_this = indexer->indices[tree].node_depths.data();
            n_terminal_this = indexer->indices[tree].n_terminal;
            node_dist_this = indexer->indices[tree].node_distances.data();
            ncomb_this = calc_ncomb(n_terminal_this);
            for (size_t ref = 0; ref < n_ref; ref++)
            {
                i = ind_this[row];
                j = ref_this[ref];

                if (unlikely(i == j))
                    rmat_this[ref] += node_depths_this[i] + 3.;
                else
                    rmat_this[ref] += node_dist_this[ix_comb(i, j, n_terminal_this, ncomb_this)];
            }
        }
    }

    check_interrupt_switch(ss);

    size_t size_rmat = nrows * n_ref;
    if (standardize_dist)
    {
        double ntrees_dbl = (double)ntrees;
        double div_trees = (double)(mult2(ntrees));
        #ifndef _WIN32
        #pragma omp simd
        #endif
        for (size_t ix = 0; ix < size_rmat; ix++)
            rmat[ix] = std::exp2( - (rmat[ix] - ntrees_dbl) / div_trees);
    }

    else
    {
        double div_trees = (double)ntrees;
        for (size_t ix = 0; ix < size_rmat; ix++)
            rmat[ix] /= div_trees;
    }

    check_interrupt_switch(ss);
}